

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

nullable_omittable_field<discordpp::Snowflake> * __thiscall
discordpp::nullable_omittable_field<discordpp::Snowflake>::operator=
          (nullable_omittable_field<discordpp::Snowflake> *this)

{
  nullable_omittable_field<discordpp::Snowflake> *this_local;
  
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::operator=
            (&(this->super_field<discordpp::Snowflake>).t_,(nullptr_t)0x0);
  (this->super_field<discordpp::Snowflake>).s_ = omitted_e;
  return this;
}

Assistant:

virtual nullable_omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }